

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

string * __thiscall
fmt::v5::vformat_abi_cxx11_
          (string *__return_storage_ptr__,v5 *this,string_view format_str,format_args args)

{
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  undefined **local_230;
  undefined1 *local_228;
  long lStack_220;
  undefined8 local_218;
  undefined1 local_210 [504];
  
  args_00.field_1 =
       (anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_2
        )args.
         super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
         .types_;
  args_00.types_ = format_str.size_;
  format_str_00.size_ = format_str.data_;
  lStack_220 = 0;
  local_230 = &PTR_grow_00144ae0;
  local_218 = 500;
  format_str_00.data_ = (char *)this;
  local_228 = local_210;
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_230,format_str_00,args_00);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_228,local_228 + lStack_220);
  local_230 = &PTR_grow_00144ae0;
  if (local_228 != local_210) {
    operator_delete(local_228);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string vformat(string_view format_str, format_args args) {
  memory_buffer buffer;
  vformat_to(buffer, format_str, args);
  return fmt::to_string(buffer);
}